

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

string * __thiscall
spirv_cross::Compiler::get_block_fallback_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,VariableID id)

{
  SPIRVariable *pSVar1;
  string *psVar2;
  SPIRType *pSVar3;
  TypedID<(spirv_cross::Types)2> *in_R9;
  uint32_t local_2c;
  
  local_2c = id.id;
  pSVar1 = get<spirv_cross::SPIRVariable>(this,id.id);
  psVar2 = ParsedIR::get_name_abi_cxx11_(&this->ir,(ID)id.id);
  if (psVar2->_M_string_length == 0) {
    pSVar3 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc);
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&>
              (__return_storage_ptr__,(spirv_cross *)0x330c68,
               (char (*) [2])&(pSVar3->super_IVariant).self,
               (TypedID<(spirv_cross::Types)0> *)0x330c68,(char (*) [2])&local_2c,in_R9);
  }
  else {
    psVar2 = ParsedIR::get_name_abi_cxx11_(&this->ir,(ID)id.id);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Compiler::get_block_fallback_name(VariableID id) const
{
	auto &var = get<SPIRVariable>(id);
	if (get_name(id).empty())
		return join("_", get<SPIRType>(var.basetype).self, "_", id);
	else
		return get_name(id);
}